

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O0

unsigned_long mbedtls_timing_get_timer(mbedtls_timing_hr_time *val,int reset)

{
  undefined1 local_40 [8];
  timeval now;
  unsigned_long delta;
  _hr_time *t;
  int reset_local;
  mbedtls_timing_hr_time *val_local;
  
  if (reset == 0) {
    gettimeofday((timeval *)local_40,(__timezone_ptr_t)0x0);
    val_local = (mbedtls_timing_hr_time *)
                (((long)local_40 - *(long *)val->opaque) * 1000 +
                (now.tv_sec - *(long *)(val->opaque + 8)) / 1000);
  }
  else {
    gettimeofday((timeval *)val,(__timezone_ptr_t)0x0);
    val_local = (mbedtls_timing_hr_time *)0x0;
  }
  return (unsigned_long)val_local;
}

Assistant:

unsigned long mbedtls_timing_get_timer( struct mbedtls_timing_hr_time *val, int reset )
{
    struct _hr_time *t = (struct _hr_time *) val;

    if( reset )
    {
        gettimeofday( &t->start, NULL );
        return( 0 );
    }
    else
    {
        unsigned long delta;
        struct timeval now;
        gettimeofday( &now, NULL );
        delta = ( now.tv_sec  - t->start.tv_sec  ) * 1000ul
              + ( now.tv_usec - t->start.tv_usec ) / 1000;
        return( delta );
    }
}